

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_st_seg.c
# Opt level: O2

int agg_st_seg(model_def_t *mdef,lexicon_t *lex,feat_t *fcb,uint32 *ts2cb,int32 *cb2mllr,
              segdmp_type_t type)

{
  uint uVar1;
  float32 ***pppfVar2;
  float32 **ppfVar3;
  mfcc_t **ppmVar4;
  float32 *pfVar5;
  mfcc_t *pmVar6;
  int32 iVar7;
  feat_t *fcb_00;
  model_def_t *mdef_00;
  int iVar8;
  cmd_ln_t *cmdln;
  uint32 *ptr;
  char *pcVar9;
  mfcc_t ***feat;
  void *ptr_00;
  ulong uVar10;
  ulong uVar11;
  uint32 s;
  ulong uVar12;
  ulong uVar13;
  uint32 *puVar14;
  ulong uVar15;
  float fVar16;
  vector_t *mfcc;
  uint local_c8;
  int32 n_frame;
  uint local_c0;
  uint32 n_mllr_cls;
  float32 ****a;
  int32 n_frame_1;
  float32 ***b;
  uint32 n_stream_tmp;
  uint32 local_9c;
  mfcc_t ***local_98;
  uint32 *local_90;
  ulong local_88;
  acmod_id_t *phone;
  uint16 *seg;
  char *trans;
  feat_t *local_68;
  model_def_t *local_60;
  lexicon_t *local_58;
  long local_50;
  uint32 *local_48;
  int32 *local_40;
  uint32 *veclen_tmp;
  
  mfcc = (vector_t *)0x0;
  a = (float32 ****)0x0;
  b = (float32 ***)0x0;
  local_60 = mdef;
  local_58 = lex;
  local_48 = ts2cb;
  local_40 = cb2mllr;
  cmdln = cmd_ln_get();
  local_50 = cmd_ln_int_r(cmdln,"-ceplen");
  local_c8 = fcb->n_sv;
  if (local_c8 == 0) {
    local_c8 = fcb->n_stream;
  }
  if (fcb->lda == (mfcc_t ***)0x0) {
    puVar14 = fcb->sv_len;
    if (puVar14 == (uint32 *)0x0) {
      puVar14 = fcb->stream_len;
    }
  }
  else {
    puVar14 = &fcb->out_dim;
  }
  local_68 = fcb;
  local_c0 = corpus_get_begin();
  uVar11 = (ulong)local_c8;
  ptr = (uint32 *)0x0;
  feat = (mfcc_t ***)0x0;
  while( true ) {
    iVar8 = corpus_next_utt();
    if (iVar8 == 0) {
      if (mfcc != (vector_t *)0x0) {
        free(*mfcc);
        ckd_free(mfcc);
        mfcc = (vector_t *)0x0;
      }
      if (feat != (mfcc_t ***)0x0) {
        feat_array_free(feat);
      }
      if (ptr != (uint32 *)0x0) {
        ckd_free(ptr);
      }
      return 0;
    }
    if (local_c0 % 0xfa == 0) {
      err_msg(ERR_INFOCONT,(char *)0x0,0," [%u]",(ulong)local_c0);
    }
    if (mfcc != (vector_t *)0x0) {
      free(*mfcc);
      ckd_free(mfcc);
      mfcc = (vector_t *)0x0;
    }
    iVar8 = corpus_get_generic_featurevec(&mfcc,&n_frame,(uint32)local_50);
    if (iVar8 < 0) break;
    if (ptr != (uint32 *)0x0) {
      ckd_free(ptr);
    }
    iVar7 = n_frame;
    corpus_get_sent(&trans);
    corpus_get_seg(&seg,&n_frame_1);
    mdef_00 = local_60;
    if (n_frame_1 == iVar7) {
      mk_phone_seq(&phone,&local_9c,trans,local_60->acmod_set,local_58);
      ptr = mk_sseq(seg,n_frame_1,phone,local_9c,mdef_00);
      ckd_free(phone);
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
              ,0x6d,"# frames in feature stream, %u != # frames in seg file %u; skipping\n",
              (ulong)(uint)iVar7);
      ptr = (uint32 *)0x0;
    }
    ckd_free(seg);
    ckd_free(trans);
    if (ptr == (uint32 *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
              ,0xb9,"senone sequence not produced; skipping.\n");
      free(*mfcc);
      ckd_free(mfcc);
      feat_array_free(feat);
    }
    else {
      if (feat != (mfcc_t ***)0x0) {
        feat_array_free(feat);
      }
      fcb_00 = local_68;
      if (n_frame < 9) {
        pcVar9 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                ,200,"utt %s too short\n",pcVar9);
        if (mfcc != (vector_t *)0x0) {
          ckd_free(*mfcc);
          ckd_free(mfcc);
          mfcc = (vector_t *)0x0;
        }
        feat = (mfcc_t ***)0x0;
      }
      else {
        feat = feat_array_alloc(local_68,n_frame + local_68->window_size);
        feat_s2mfc2feat_live(fcb_00,(mfcc_t **)mfcc,&n_frame,1,1,feat);
        iVar8 = corpus_has_xfrm();
        if (iVar8 != 0) {
          if (a != (float32 ****)0x0) {
            for (uVar15 = 0; uVar15 < n_mllr_cls; uVar15 = uVar15 + 1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                ckd_free_2d(a[uVar15][uVar13]);
              }
            }
            ckd_free_2d(a);
          }
          if (b != (float32 ***)0x0) {
            for (uVar15 = 0; uVar15 < n_mllr_cls; uVar15 = uVar15 + 1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                ckd_free(b[uVar15][uVar13]);
              }
            }
          }
          corpus_get_xfrm(&a,&b,&veclen_tmp,&n_mllr_cls,&n_stream_tmp);
          if (local_c8 != n_stream_tmp) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                    ,0xec,"Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
                    (ulong)local_c8);
            goto LAB_00104373;
          }
          for (uVar15 = 0; uVar15 < n_mllr_cls; uVar15 = uVar15 + 1) {
            for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
              invert(a[uVar15][uVar13],a[uVar15][uVar13],puVar14[uVar13]);
            }
          }
        }
        local_98 = feat;
        local_90 = ptr;
        for (uVar15 = 0; uVar15 < (uint)n_frame; uVar15 = uVar15 + 1) {
          local_88 = uVar15;
          iVar8 = corpus_has_xfrm();
          if (iVar8 != 0) {
            pppfVar2 = a[(uint)local_40[local_48[local_90[local_88]]]];
            ppfVar3 = b[(uint)local_40[local_48[local_90[local_88]]]];
            ppmVar4 = local_98[local_88];
            for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
              uVar1 = puVar14[uVar15];
              for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
                ppmVar4[uVar15][uVar13] =
                     (mfcc_t)((float)ppmVar4[uVar15][uVar13] - (float)ppfVar3[uVar15][uVar13]);
              }
              ptr_00 = __ckd_calloc__((ulong)uVar1,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                                      ,0x4b);
              uVar13 = (ulong)puVar14[uVar15];
              for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
                pfVar5 = pppfVar2[uVar15][uVar10];
                pmVar6 = ppmVar4[uVar15];
                fVar16 = *(float *)((long)ptr_00 + uVar10 * 4);
                for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
                  fVar16 = fVar16 + (float)pfVar5[uVar12] * (float)pmVar6[uVar12];
                  *(float *)((long)ptr_00 + uVar10 * 4) = fVar16;
                }
              }
              for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                ppmVar4[uVar15][uVar10] = *(mfcc_t *)((long)ptr_00 + uVar10 * 4);
              }
              ckd_free(ptr_00);
            }
          }
          uVar15 = local_88;
          ptr = local_90;
          feat = local_98;
          segdmp_add_feat(local_90[local_88],(vector_t **)(local_98 + local_88),1);
        }
      }
    }
    local_c0 = local_c0 + 1;
  }
  pcVar9 = corpus_utt();
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
          ,0xad,"Can\'t read input features from %s\n",pcVar9);
LAB_00104373:
  exit(1);
}

Assistant:

int
agg_st_seg(model_def_t *mdef,
	   lexicon_t *lex,
	   feat_t* fcb,
	   uint32 *ts2cb,
	   int32 *cb2mllr,
	   segdmp_type_t type)
{
    uint32 seq_no;
    vector_t *mfcc = NULL;
    int32 n_frame;
    vector_t **feat = NULL;
    uint32 *sseq = NULL;
    uint32 i, j;
    uint32 t;
    uint32 n_stream=0;
    uint32 n_stream_tmp;
    uint32 *veclen = NULL;
    uint32 *veclen_tmp;
    uint32 n_mllr_cls;
    float32 ****a = NULL;
    float32 ***b = NULL;
    uint32 mcls;
    int32 mfc_veclen = cmd_ln_int32("-ceplen");

    n_stream = feat_dimension1(fcb);
    veclen = feat_stream_lengths(fcb);


    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" [%u]", seq_no);
	}
	
	    if (mfcc) {
		free(mfcc[0]);
		ckd_free(mfcc);

		mfcc = NULL;
	    }

	    if (corpus_get_generic_featurevec(&mfcc, &n_frame, mfc_veclen) < 0) {
	      E_FATAL("Can't read input features from %s\n", corpus_utt());
	    }


	if (sseq != NULL) {
	    ckd_free((void *)sseq);
	    sseq = NULL;
	}

	/* read transcript and convert it into a senone sequence */
	sseq = get_sseq(mdef, lex, n_frame);
	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    free(mfcc[0]);
	    ckd_free((void *)mfcc);
	    feat_array_free(feat);

	    continue;
	}
	
	    if (feat) {
		feat_array_free(feat);
		feat = NULL;
	    }

	    if (n_frame < 9) {
	      E_WARN("utt %s too short\n", corpus_utt());
	      if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	      }
	      continue;
	    }

	    feat = feat_array_alloc(fcb, n_frame + feat_window_size(fcb));
	    feat_s2mfc2feat_live(fcb, mfcc, &n_frame, TRUE, TRUE, feat);

	    if (corpus_has_xfrm()) {
		if (a) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free_2d((void **)a[i][j]);
			}
		    }
		    ckd_free_2d((void **)a);
		}
		if (b) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free((void *)b[i][j]);
			}
		    }
		}

		corpus_get_xfrm(&a, &b,
				&veclen_tmp,
				&n_mllr_cls,
				&n_stream_tmp);

		if (n_stream != n_stream_tmp) {
		    E_FATAL("Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
			    n_stream, n_stream_tmp);
		}

		for (i = 0; i < n_mllr_cls; i++) {
		    for (j = 0; j < n_stream; j++) {
			invert(a[i][j], a[i][j], veclen[j]);
		    }
		}
	    }

	    for (t = 0; t < n_frame; t++) {
		if (corpus_has_xfrm()) {
		    /* determine the MLLR class for the frame */
		    mcls = cb2mllr[ts2cb[sseq[t]]];

		    /* Transform the feature space using the inverse MLLR transform */
		    xfrm_feat(a[mcls], b[mcls], feat[t], n_stream, veclen);
		}
		segdmp_add_feat(sseq[t], &feat[t], 1);
	    }
    }
    
    if (mfcc) {
	free(mfcc[0]);
	ckd_free(mfcc);
	
	mfcc = NULL;
    }

    if (feat) {
	feat_array_free(feat);
	feat = NULL;
    }

    if (sseq) {
	ckd_free((void *)sseq);
	sseq = NULL;
    }

    return S3_SUCCESS;
}